

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

int xmlRegAtomPush(xmlRegParserCtxtPtr ctxt,xmlRegAtomPtr atom)

{
  int iVar1;
  xmlRegAtomPtr *ppxVar2;
  uint uVar3;
  uint uVar4;
  
  iVar1 = ctxt->maxAtoms;
  if (iVar1 <= ctxt->nbAtoms) {
    if (iVar1 < 1) {
      uVar4 = 4;
    }
    else {
      uVar4 = 0xffffffff;
      if (iVar1 < 1000000000) {
        uVar3 = iVar1 + 1U >> 1;
        uVar4 = uVar3 + iVar1;
        if ((int)(1000000000 - uVar3) < iVar1) {
          uVar4 = 1000000000;
        }
      }
    }
    if (((int)uVar4 < 0) ||
       (ppxVar2 = (xmlRegAtomPtr *)(*xmlRealloc)(ctxt->atoms,(ulong)uVar4 << 3),
       ppxVar2 == (xmlRegAtomPtr *)0x0)) {
      ctxt->error = 2;
      xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                          (xmlError *)0x0);
      return -1;
    }
    ctxt->atoms = ppxVar2;
    ctxt->maxAtoms = uVar4;
  }
  iVar1 = ctxt->nbAtoms;
  atom->no = iVar1;
  ctxt->nbAtoms = iVar1 + 1;
  ctxt->atoms[iVar1] = atom;
  return 0;
}

Assistant:

static int
xmlRegAtomPush(xmlRegParserCtxtPtr ctxt, xmlRegAtomPtr atom) {
    if (atom == NULL) {
	ERROR("atom push: atom is NULL");
	return(-1);
    }
    if (ctxt->nbAtoms >= ctxt->maxAtoms) {
	xmlRegAtomPtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->maxAtoms, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
	    xmlRegexpErrMemory(ctxt);
	    return(-1);
	}
	tmp = xmlRealloc(ctxt->atoms, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    return(-1);
	}
	ctxt->atoms = tmp;
        ctxt->maxAtoms = newSize;
    }
    atom->no = ctxt->nbAtoms;
    ctxt->atoms[ctxt->nbAtoms++] = atom;
    return(0);
}